

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O3

uint32_t __thiscall cppnet::BufferBlock::FindStr(BufferBlock *this,char *s,uint32_t s_len)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  BufferBlock *pBVar5;
  int iVar6;
  int local_38;
  
  pcVar3 = this->_read;
  pcVar1 = this->_write;
  iVar4 = (int)pcVar3;
  iVar6 = (int)pcVar1;
  if (pcVar3 < pcVar1) {
    pcVar3 = _FindStrInMem(this,pcVar3,s,iVar6 - iVar4,s_len);
    if (pcVar3 == (char *)0x0) {
      return 0;
    }
    return ((int)pcVar3 - iVar4) + s_len;
  }
  if (pcVar1 < pcVar3) {
    local_38 = (int)this->_buffer_end;
    pBVar5 = this;
    pcVar3 = _FindStrInMem(this,pcVar3,s,local_38 - iVar4,s_len);
    if (pcVar3 != (char *)0x0) {
      return ((int)pcVar3 - iVar4) + s_len;
    }
    iVar2 = (int)this->_buffer_start;
    pcVar3 = _FindStrInMem(pBVar5,this->_buffer_start,s,iVar6 - iVar2,s_len);
    if (pcVar3 == (char *)0x0) {
      return 0;
    }
    iVar2 = (int)pcVar3 - iVar2;
  }
  else {
    if (this->_can_read != true) {
      return 0;
    }
    local_38 = (int)this->_buffer_end;
    pBVar5 = this;
    pcVar3 = _FindStrInMem(this,pcVar3,s,local_38 - iVar4,s_len);
    if (pcVar3 != (char *)0x0) {
      return ((int)pcVar3 - iVar4) + s_len;
    }
    iVar2 = (int)this->_buffer_start;
    pcVar3 = _FindStrInMem(pBVar5,this->_buffer_start,s,iVar6 - iVar2,s_len);
    if (pcVar3 == (char *)0x0) {
      return 0;
    }
    iVar2 = (int)pcVar3 - iVar2;
  }
  return (local_38 + s_len + iVar2) - iVar4;
}

Assistant:

uint32_t BufferBlock::FindStr(const char* s, uint32_t s_len) {
    if (_write > _read) {
        const char* find = _FindStrInMem(_read, s, uint32_t(_write - _read), s_len);
        if (find) {
            return (uint32_t)(find - _read + s_len);
        }
        return 0;
        
    } else if (_write < _read) {
        const char* find = _FindStrInMem(_read, s, uint32_t(_buffer_end - _read), s_len);
        if (find) {
            return uint32_t(find - _read + s_len);
        }
        find = _FindStrInMem(_buffer_start, s, uint32_t(_write - _buffer_start), s_len);
        if (find) {
            return uint32_t(find - _buffer_start + s_len + _buffer_end - _read);
        }
        return 0;

    } else {
        if (_can_read) {
            const char* find = _FindStrInMem(_read, s, uint32_t(_buffer_end - _read), s_len);
            if (find) {
                return uint32_t(find - _read + s_len);
            }
            find = _FindStrInMem(_buffer_start, s, uint32_t(_write - _buffer_start), s_len);
            if (find) {
                return uint32_t(find - _buffer_start + s_len + _buffer_end - _read);
            }
            return 0;

        } else {
            return 0;
        }
    }
}